

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  StorageKind SVar1;
  Module *pMVar2;
  Module *module;
  undefined1 auVar3 [16];
  Name memory;
  Name name_00;
  undefined4 index;
  Store *pSVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  pointer pFVar8;
  reference pvVar9;
  pointer pMVar10;
  address64_t aVar11;
  Type type;
  Const *pCVar12;
  GlobalGet *value;
  Break *any;
  LocalGet *left;
  Load *value_00;
  Store *pSVar13;
  LocalSet *args;
  Break *args_1;
  Loop *first;
  LocalGet *pLVar14;
  Binary *pBVar15;
  If *left_00;
  Block *pBVar16;
  pointer pEVar17;
  Name NVar18;
  Name NVar19;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name value_01;
  Name value_02;
  pointer local_420;
  Name local_328;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_318;
  reference local_310;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  bool memoryExported;
  Name local_2d0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_2c0;
  string_view local_2b8;
  size_t local_2a8;
  char *pcStack_2a0;
  Type local_290;
  size_t local_288;
  size_t sStack_280;
  Type local_270;
  Address local_268;
  Address local_260;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  size_t sStack_228;
  Name loadMemoryName;
  anon_class_16_2_204a708a getFuncIdx;
  Name local_200;
  undefined1 local_1ec [8];
  Index funcIdxVar;
  char *pcStack_1e0;
  Type local_1d8;
  Type local_1d0;
  size_t local_1c8;
  char *pcStack_1c0;
  Address local_1b8;
  reference local_1b0;
  Name *global;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range3;
  uint32_t offset;
  Type local_178;
  Address local_170;
  Store *local_168;
  Expression *writeData;
  bool local_158 [8];
  Address local_150;
  Name local_148;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_138;
  ulong local_130;
  size_t pages;
  anon_class_16_2_22e62c78 profileSizeConst;
  anon_class_16_2_29deed5a hashConst;
  anon_class_8_1_911e227b getSize;
  anon_class_8_1_911e227b getAddr;
  Builder builder;
  size_t profileSize;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_d8 [2];
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_b8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type *local_88;
  char *local_80;
  Type local_78;
  Signature local_70;
  HeapType local_60;
  char *local_58;
  HeapType HStack_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  char *pcStack_28;
  Name name;
  size_t numFuncs_local;
  Instrumenter *this_local;
  
  pMVar2 = this->wasm;
  Name::Name((Name *)&writeProfile,&this->config->profileExport);
  NVar18 = Names::getValidFunctionName(pMVar2,(Name)_writeProfile);
  pcStack_28 = NVar18.super_IString.str._M_len;
  name.super_IString.str._M_len = NVar18.super_IString.str._M_str;
  local_58 = pcStack_28;
  HStack_50.id = name.super_IString.str._M_len;
  Type::Type(&local_98,i32);
  Type::Type(&local_90,i32);
  local_80 = (char *)0x2;
  local_88 = &local_98;
  ::wasm::Type::Type(&local_78,&local_98,2);
  Type::Type(&local_a0,i32);
  Signature::Signature(&local_70,local_78,local_a0);
  ::wasm::HeapType::HeapType(&local_60,local_70);
  local_b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_b8);
  name_01.super_IString.str._M_str = local_58;
  name_01.super_IString.str._M_len = (size_t)&local_40;
  Builder::makeFunction
            (name_01,HStack_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_60.id,
             (Expression *)&local_b8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_b8);
  pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  (pFVar8->super_Importable).super_Named.hasExplicitName = true;
  pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  Name::Name((Name *)local_d8,"addr");
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d8[0]._M_allocated_capacity;
  ::wasm::Function::setLocalName((uint)pFVar8,(Name)(auVar3 << 0x40));
  pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  Name::Name((Name *)&profileSize,"size");
  NVar19.super_IString.str._M_str = (char *)profileSize;
  NVar19.super_IString.str._M_len = 1;
  ::wasm::Function::setLocalName((uint)pFVar8,NVar19);
  builder.wasm = (Module *)(numFuncs * 4 + 8);
  Builder::Builder((Builder *)&getAddr,this->wasm);
  getSize.builder = (Builder *)&getAddr;
  hashConst.this = (Instrumenter *)&getAddr;
  profileSizeConst.profileSize = (size_t *)&getAddr;
  pages = (size_t)&getAddr;
  profileSizeConst.builder = &builder;
  local_130 = (ulong)((long)&builder.wasm[0x4e].exports.
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 7U) >> 0x10;
  hashConst.builder = (Builder *)this;
  bVar6 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&this->wasm->memories);
  if (bVar6) {
    pMVar2 = this->wasm;
    Name::Name(&local_148,"0");
    Address::Address(&local_150,0);
    Address::Address((Address *)local_158,0x10000);
    Type::Type((Type *)&writeData,i32);
    name_02.super_IString.str._M_str = (char *)local_148.super_IString.str._M_len;
    name_02.super_IString.str._M_len = (size_t)&local_138;
    Builder::makeMemory(name_02,(Address)local_148.super_IString.str._M_str,local_150,local_158[0],
                        (Type)0x0);
    ::wasm::Module::addMemory((unique_ptr *)pMVar2);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_138);
    uVar5 = local_130;
    pvVar9 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
    Address::operator=(&pMVar10->initial,uVar5);
    uVar5 = local_130;
    pvVar9 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
    Address::operator=(&pMVar10->max,uVar5);
  }
  else {
    pvVar9 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
    aVar11 = Address::operator_cast_to_unsigned_long(&pMVar10->initial);
    uVar5 = local_130;
    if (aVar11 < local_130) {
      pvVar9 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar9);
      Address::operator=(&pMVar10->initial,uVar5);
      pvVar9 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar9);
      aVar11 = Address::operator_cast_to_unsigned_long(&pMVar10->max);
      uVar5 = local_130;
      if (aVar11 < local_130) {
        pvVar9 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::operator[](&this->wasm->memories,0);
        pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                            (pvVar9);
        Address::operator=(&pMVar10->max,uVar5);
      }
    }
  }
  Address::Address(&local_170,0);
  type.id = (uintptr_t)addProfileExport::anon_class_8_1_911e227b::operator()(&getSize);
  pCVar12 = addProfileExport::anon_class_16_2_29deed5a::operator()
                      ((anon_class_16_2_29deed5a *)&profileSizeConst.profileSize);
  Type::Type(&local_178,i64);
  pvVar9 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&this->wasm->memories,0);
  pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
  local_168 = Builder::makeStore((Builder *)&getAddr,8,local_170,1,(Expression *)type.id,
                                 (Expression *)pCVar12,local_178,
                                 (Name)(pMVar10->super_Importable).super_Named.name.super_IString.
                                       str);
  __range3._4_4_ = 8;
  SVar1 = this->config->storageKind;
  if (SVar1 == InGlobals) {
    __end3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(&this->functionGlobals);
    global = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                               (&this->functionGlobals);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                       *)&global), bVar6) {
      local_1b0 = __gnu_cxx::
                  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                  ::operator*(&__end3);
      pSVar4 = local_168;
      Address::Address(&local_1b8,(ulong)__range3._4_4_);
      pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()(&getSize);
      local_1c8 = (local_1b0->super_IString).str._M_len;
      pcStack_1c0 = (local_1b0->super_IString).str._M_str;
      Type::Type(&local_1d0,i32);
      name_00.super_IString.str._M_str = pcStack_1c0;
      name_00.super_IString.str._M_len = local_1c8;
      value = Builder::makeGlobalGet((Builder *)&getAddr,name_00,local_1d0);
      Type::Type(&local_1d8,i32);
      pvVar9 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar9);
      unique0x10000d14 = (pMVar10->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_1e0 = (pMVar10->super_Importable).super_Named.name.super_IString.str._M_str;
      pSVar13 = Builder::makeStore((Builder *)&getAddr,4,local_1b8,1,(Expression *)pLVar14,
                                   (Expression *)value,local_1d8,
                                   (Name)(pMVar10->super_Importable).super_Named.name.super_IString.
                                         str);
      local_168 = (Store *)Builder::blockify((Builder *)&getAddr,(Expression *)pSVar4,
                                             (Expression *)pSVar13);
      __range3._4_4_ = __range3._4_4_ + 4;
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end3);
    }
  }
  else if (SVar1 - InMemory < 2) {
    pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_40);
    Name::Name(&local_200,"funcIdx");
    Type::Type((Type *)&getFuncIdx.funcIdxVar,i32);
    name_04.super_IString.str._M_str = (char *)getFuncIdx.funcIdxVar;
    name_04.super_IString.str._M_len = (size_t)local_200.super_IString.str._M_str;
    local_1ec._0_4_ =
         Builder::addVar((Builder *)pFVar8,(Function *)local_200.super_IString.str._M_len,name_04,
                         type);
    loadMemoryName.super_IString.str._M_str = (char *)&getAddr;
    getFuncIdx.builder = (Builder *)local_1ec;
    if (this->config->storageKind == InMemory) {
      pvVar9 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      local_420 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                            (pvVar9);
    }
    else {
      local_420 = (pointer)&this->secondaryMemory;
    }
    pSVar4 = local_168;
    sStack_228 = (local_420->super_Importable).super_Named.name.super_IString.str._M_len;
    loadMemoryName.super_IString.str._M_len =
         (size_t)(local_420->super_Importable).super_Named.name.super_IString.str._M_str;
    Name::Name((Name *)&local_238,"outer");
    Name::Name((Name *)&local_248,"l");
    Name::Name((Name *)&local_258,"outer");
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    name.super_IString.str._M_str._0_4_ = (uint)numFuncs;
    pCVar12 = Builder::makeConst<unsigned_int>
                        ((Builder *)&getAddr,(uint)name.super_IString.str._M_str);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr,EqInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    any = Builder::makeBreak((Builder *)&getAddr,(Name)local_258,(Expression *)0x0,
                             (Expression *)pBVar15);
    Address::Address(&local_260,8);
    pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()(&getSize);
    left = addProfileExport::anon_class_16_2_204a708a::operator()
                     ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getAddr,4);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr,MulInt32,(Expression *)left,
                                  (Expression *)pCVar12);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pBVar15);
    Address::Address(&local_268,0);
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    Type::Type(&local_270,i32);
    local_288 = sStack_228;
    sStack_280 = loadMemoryName.super_IString.str._M_len;
    memory.super_IString.str._M_str = (char *)loadMemoryName.super_IString.str._M_len;
    memory.super_IString.str._M_len = sStack_228;
    value_00 = Builder::makeAtomicLoad
                         ((Builder *)&getAddr,1,local_268,(Expression *)pLVar14,local_270,memory);
    Type::Type(&local_290,i32);
    pvVar9 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
    local_2a8 = (pMVar10->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_2a0 = (pMVar10->super_Importable).super_Named.name.super_IString.str._M_str;
    pSVar13 = Builder::makeStore((Builder *)&getAddr,4,local_260,4,(Expression *)pBVar15,
                                 (Expression *)value_00,local_290,
                                 (Name)(pMVar10->super_Importable).super_Named.name.super_IString.
                                       str);
    index = local_1ec._0_4_;
    pLVar14 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)&loadMemoryName.super_IString.str._M_str);
    pCVar12 = Builder::makeConst<unsigned_int>((Builder *)&getAddr,1);
    pBVar15 = Builder::makeBinary((Builder *)&getAddr,AddInt32,(Expression *)pLVar14,
                                  (Expression *)pCVar12);
    args = Builder::makeLocalSet((Builder *)&getAddr,index,(Expression *)pBVar15);
    Name::Name((Name *)&local_2b8,"l");
    args_1 = Builder::makeBreak((Builder *)&getAddr,(Name)local_2b8,(Expression *)0x0,
                                (Expression *)0x0);
    pBVar16 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        ((Builder *)&getAddr,(Expression *)any,(Expression *)pSVar13,args,args_1);
    first = Builder::makeLoop((Builder *)&getAddr,(Name)local_248,(Expression *)pBVar16);
    pBVar16 = Builder::makeBlock((Builder *)&getAddr,(Name)local_238,(Expression *)first);
    local_168 = (Store *)Builder::blockify((Builder *)&getAddr,(Expression *)pSVar4,
                                           (Expression *)pBVar16);
  }
  pLVar14 = addProfileExport::anon_class_8_1_911e227b::operator()
                      ((anon_class_8_1_911e227b *)&hashConst.this);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&pages);
  pBVar15 = Builder::makeBinary((Builder *)&getAddr,GeUInt32,(Expression *)pLVar14,
                                (Expression *)pCVar12);
  left_00 = Builder::makeIf((Builder *)&getAddr,(Expression *)pBVar15,(Expression *)local_168,
                            (Expression *)0x0);
  pCVar12 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&pages);
  pBVar16 = Builder::makeSequence((Builder *)&getAddr,(Expression *)left_00,(Expression *)pCVar12);
  pFVar8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  pFVar8->body = (Expression *)pBVar16;
  ::wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar2 = this->wasm;
  Name::Name(&local_2d0,&this->config->profileExport);
  name_03.super_IString.str._M_str = (char *)local_2d0.super_IString.str._M_len;
  name_03.super_IString.str._M_len = (size_t)&local_2c0;
  value_01.super_IString.str._M_str = pcStack_28;
  value_01.super_IString.str._M_len = (size_t)local_2d0.super_IString.str._M_str;
  Builder::makeExport(name_03,value_01,(ExternalKind)NVar18.super_IString.str._M_str);
  ::wasm::Module::addExport((unique_ptr *)pMVar2);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_2c0);
  pvVar9 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[](&this->wasm->memories,0);
  pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar9);
  bVar6 = Importable::imported(&pMVar10->super_Importable);
  if (!bVar6) {
    bVar6 = false;
    pMVar2 = this->wasm;
    __end2 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&pMVar2->exports);
    ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end(&pMVar2->exports);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                       *)&ex), bVar7) {
      local_310 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                  ::operator*(&__end2);
      pEVar17 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                          (local_310);
      if (pEVar17->kind == Memory) {
        bVar6 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar6) {
      pMVar2 = this->wasm;
      Name::Name(&local_328,"profile-memory");
      module = this->wasm;
      pvVar9 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&module->memories,0);
      pMVar10 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar9);
      NVar19 = Names::getValidExportName
                         (module,(Name)(pMVar10->super_Importable).super_Named.name.super_IString.
                                       str);
      NVar18.super_IString.str._M_str = (char *)local_328.super_IString.str._M_len;
      NVar18.super_IString.str._M_len = (size_t)&local_318;
      value_02.super_IString.str._M_str = NVar19.super_IString.str._M_len;
      value_02.super_IString.str._M_len = (size_t)local_328.super_IString.str._M_str;
      Builder::makeExport(NVar18,value_02,(ExternalKind)NVar19.super_IString.str._M_str);
      ::wasm::Module::addExport((unique_ptr *)pMVar2);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_318);
    }
  }
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile = Builder::makeFunction(
    name, Signature({Type::i32, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, Type::i32); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Also make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}